

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_setup_encoder
                   (opj_jp2_t *jp2,opj_cparameters_t *parameters,opj_image_t *image,
                   opj_event_mgr_t *p_manager)

{
  OPJ_UINT16 OVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  bool bVar4;
  OPJ_BOOL OVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  OPJ_UINT32 *pOVar8;
  opj_jp2_comps_t *poVar9;
  ulong uVar10;
  opj_jp2_cdef_t *poVar11;
  opj_jp2_cdef_info_t *poVar12;
  OPJ_UINT16 *pOVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  OPJ_UINT16 *pOVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  
  if (image == (opj_image_t *)0x0 ||
      (parameters == (opj_cparameters_t *)0x0 || jp2 == (opj_jp2_t *)0x0)) {
    return 0;
  }
  if (image->numcomps - 0x4001 < 0xffffc000) {
    pcVar14 = "Invalid number of components specified while setting up JP2 encoder\n";
    goto LAB_0011d6a9;
  }
  OVar5 = opj_j2k_setup_encoder(jp2->j2k,parameters,image,p_manager);
  if (OVar5 == 0) {
    return 0;
  }
  jp2->brand = 0x6a703220;
  jp2->minversion = 0;
  jp2->numcl = 1;
  pOVar8 = (OPJ_UINT32 *)opj_malloc(4);
  jp2->cl = pOVar8;
  if (pOVar8 != (OPJ_UINT32 *)0x0) {
    *pOVar8 = 0x6a703220;
    uVar2 = image->numcomps;
    jp2->numcomps = uVar2;
    poVar9 = (opj_jp2_comps_t *)opj_malloc((ulong)uVar2 * 0xc);
    jp2->comps = poVar9;
    if (poVar9 != (opj_jp2_comps_t *)0x0) {
      jp2->h = image->y1 - image->y0;
      jp2->w = image->x1 - image->x0;
      poVar3 = image->comps;
      OVar6 = poVar3->prec;
      jp2->bpc = (poVar3->sgnd * 0x80 + OVar6) - 1;
      uVar2 = image->numcomps;
      uVar15 = (ulong)uVar2;
      if (1 < uVar15) {
        lVar18 = 0;
        do {
          if (OVar6 != *(OPJ_UINT32 *)((long)&poVar3[1].prec + lVar18)) {
            jp2->bpc = 0xff;
          }
          lVar18 = lVar18 + 0x40;
        } while (uVar15 * 0x40 + -0x40 != lVar18);
      }
      jp2->C = 7;
      jp2->UnkC = 0;
      jp2->IPR = 0;
      if (uVar15 != 0) {
        pOVar8 = &poVar3->sgnd;
        lVar18 = 0;
        do {
          *(OPJ_UINT32 *)((long)&poVar9->bpcc + lVar18) = pOVar8[-2] + *pOVar8 * 0x80 + -1;
          pOVar8 = pOVar8 + 0x10;
          lVar18 = lVar18 + 0xc;
        } while (uVar15 * 0xc != lVar18);
      }
      if (image->icc_profile_len == 0) {
        jp2->meth = 1;
        if ((uint)(image->color_space + OPJ_CLRSPC_UNKNOWN) < 3) {
          OVar6 = image->color_space + 0xf;
          goto LAB_0011d6e1;
        }
      }
      else {
        jp2->meth = 2;
        OVar6 = 0;
LAB_0011d6e1:
        jp2->enumcs = OVar6;
      }
      iVar19 = 0;
      uVar7 = 0;
      if (uVar15 != 0) {
        pOVar13 = &poVar3->alpha;
        uVar16 = 0;
        uVar10 = 0;
        iVar19 = 0;
        do {
          if (*pOVar13 != 0) {
            uVar10 = uVar16 & 0xffffffff;
          }
          uVar7 = (uint)uVar10;
          iVar19 = iVar19 + (uint)(*pOVar13 != 0);
          uVar16 = uVar16 + 1;
          pOVar13 = pOVar13 + 0x20;
        } while (uVar15 != uVar16);
      }
      if (iVar19 == 0) {
        bVar4 = false;
        uVar20 = 0;
      }
      else {
        if (iVar19 == 1) {
          OVar6 = jp2->enumcs;
          uVar20 = 3;
          bVar4 = false;
          if ((OVar6 != 0x10) && (OVar6 != 0x12)) {
            if (OVar6 == 0x11) {
              uVar20 = 1;
              bVar4 = false;
            }
            else {
              uVar20 = 0;
              bVar4 = true;
            }
          }
          if (bVar4) {
            pcVar14 = "Alpha channel specified but unknown enumcs. No cdef box will be created.\n";
          }
          else if (uVar20 < uVar2) {
            bVar4 = true;
            if (uVar20 <= uVar7) goto LAB_0011d79a;
            pcVar14 = 
            "Alpha channel position conflicts with color channel. No cdef box will be created.\n";
          }
          else {
            pcVar14 = 
            "Alpha channel specified but not enough image components for an automatic cdef box creation.\n"
            ;
          }
        }
        else {
          uVar20 = 0;
          pcVar14 = "Multiple alpha channels specified. No cdef box will be created.\n";
        }
        bVar4 = false;
        opj_event_msg(p_manager,2,pcVar14);
      }
LAB_0011d79a:
      if (!bVar4) {
LAB_0011d86c:
        jp2->precedence = 0;
        jp2->approx = 0;
        jp2->jpip_on = parameters->jpip_on;
        return 1;
      }
      poVar11 = (opj_jp2_cdef_t *)opj_malloc(0x10);
      (jp2->color).jp2_cdef = poVar11;
      if (poVar11 != (opj_jp2_cdef_t *)0x0) {
        poVar12 = (opj_jp2_cdef_info_t *)opj_malloc((ulong)image->numcomps * 6);
        poVar11 = (jp2->color).jp2_cdef;
        poVar11->info = poVar12;
        if (poVar12 != (opj_jp2_cdef_info_t *)0x0) {
          uVar2 = image->numcomps;
          poVar11->n = (OPJ_UINT16)uVar2;
          if (uVar20 == 0) {
            uVar15 = 0;
          }
          else {
            pOVar13 = &poVar12->asoc;
            uVar15 = 0;
            do {
              ((opj_jp2_cdef_info_t *)(pOVar13 + -2))->cn = (OPJ_UINT16)uVar15;
              pOVar13[-1] = 0;
              uVar15 = uVar15 + 1;
              *pOVar13 = (OPJ_UINT16)uVar15;
              pOVar13 = pOVar13 + 3;
            } while (uVar20 != uVar15);
          }
          if ((uint)uVar15 < uVar2) {
            uVar15 = uVar15 & 0xffffffff;
            pOVar13 = &poVar12[uVar15].asoc;
            pOVar17 = &image->comps[uVar15].alpha;
            do {
              OVar1 = *pOVar17;
              ((opj_jp2_cdef_info_t *)(pOVar13 + -2))->cn = (ushort)uVar15;
              pOVar13[-1] = -(ushort)(OVar1 == 0) | 1;
              *pOVar13 = -(ushort)(OVar1 == 0);
              uVar15 = uVar15 + 1;
              pOVar13 = pOVar13 + 3;
              pOVar17 = pOVar17 + 0x20;
            } while (uVar2 != uVar15);
          }
          goto LAB_0011d86c;
        }
      }
      pcVar14 = "Not enough memory to setup the JP2 encoder\n";
      goto LAB_0011d6a9;
    }
  }
  pcVar14 = "Not enough memory when setup the JP2 encoder\n";
LAB_0011d6a9:
  opj_event_msg(p_manager,1,pcVar14);
  return 0;
}

Assistant:

OPJ_BOOL opj_jp2_setup_encoder(opj_jp2_t *jp2,
                               opj_cparameters_t *parameters,
                               opj_image_t *image,
                               opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i;
    OPJ_UINT32 depth_0;
    OPJ_UINT32 sign;
    OPJ_UINT32 alpha_count;
    OPJ_UINT32 color_channels = 0U;
    OPJ_UINT32 alpha_channel = 0U;


    if (!jp2 || !parameters || !image) {
        return OPJ_FALSE;
    }

    /* setup the J2K codec */
    /* ------------------- */

    /* Check if number of components respects standard */
    if (image->numcomps < 1 || image->numcomps > 16384) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid number of components specified while setting up JP2 encoder\n");
        return OPJ_FALSE;
    }

    if (opj_j2k_setup_encoder(jp2->j2k, parameters, image,
                              p_manager) == OPJ_FALSE) {
        return OPJ_FALSE;
    }

    /* setup the JP2 codec */
    /* ------------------- */

    /* Profile box */

    jp2->brand = JP2_JP2;   /* BR */
    jp2->minversion = 0;    /* MinV */
    jp2->numcl = 1;
    jp2->cl = (OPJ_UINT32*) opj_malloc(jp2->numcl * sizeof(OPJ_UINT32));
    if (!jp2->cl) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory when setup the JP2 encoder\n");
        return OPJ_FALSE;
    }
    jp2->cl[0] = JP2_JP2;   /* CL0 : JP2 */

    /* Image Header box */

    jp2->numcomps = image->numcomps;    /* NC */
    jp2->comps = (opj_jp2_comps_t*) opj_malloc(jp2->numcomps * sizeof(
                     opj_jp2_comps_t));
    if (!jp2->comps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory when setup the JP2 encoder\n");
        /* Memory of jp2->cl will be freed by opj_jp2_destroy */
        return OPJ_FALSE;
    }

    jp2->h = image->y1 - image->y0;     /* HEIGHT */
    jp2->w = image->x1 - image->x0;     /* WIDTH */
    /* BPC */
    depth_0 = image->comps[0].prec - 1;
    sign = image->comps[0].sgnd;
    jp2->bpc = depth_0 + (sign << 7);
    for (i = 1; i < image->numcomps; i++) {
        OPJ_UINT32 depth = image->comps[i].prec - 1;
        sign = image->comps[i].sgnd;
        if (depth_0 != depth) {
            jp2->bpc = 255;
        }
    }
    jp2->C = 7;         /* C : Always 7 */
    jp2->UnkC = 0;      /* UnkC, colorspace specified in colr box */
    jp2->IPR = 0;       /* IPR, no intellectual property */

    /* BitsPerComponent box */
    for (i = 0; i < image->numcomps; i++) {
        jp2->comps[i].bpcc = image->comps[i].prec - 1 + (image->comps[i].sgnd << 7);
    }

    /* Colour Specification box */
    if (image->icc_profile_len) {
        jp2->meth = 2;
        jp2->enumcs = 0;
    } else {
        jp2->meth = 1;
        if (image->color_space == 1) {
            jp2->enumcs = 16;    /* sRGB as defined by IEC 61966-2-1 */
        } else if (image->color_space == 2) {
            jp2->enumcs = 17;    /* greyscale */
        } else if (image->color_space == 3) {
            jp2->enumcs = 18;    /* YUV */
        }
    }

    /* Channel Definition box */
    /* FIXME not provided by parameters */
    /* We try to do what we can... */
    alpha_count = 0U;
    for (i = 0; i < image->numcomps; i++) {
        if (image->comps[i].alpha != 0) {
            alpha_count++;
            alpha_channel = i;
        }
    }
    if (alpha_count == 1U) { /* no way to deal with more than 1 alpha channel */
        switch (jp2->enumcs) {
        case 16:
        case 18:
            color_channels = 3;
            break;
        case 17:
            color_channels = 1;
            break;
        default:
            alpha_count = 0U;
            break;
        }
        if (alpha_count == 0U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel specified but unknown enumcs. No cdef box will be created.\n");
        } else if (image->numcomps < (color_channels + 1)) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel specified but not enough image components for an automatic cdef box creation.\n");
            alpha_count = 0U;
        } else if ((OPJ_UINT32)alpha_channel < color_channels) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel position conflicts with color channel. No cdef box will be created.\n");
            alpha_count = 0U;
        }
    } else if (alpha_count > 1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Multiple alpha channels specified. No cdef box will be created.\n");
    }
    if (alpha_count == 1U) { /* if here, we know what we can do */
        jp2->color.jp2_cdef = (opj_jp2_cdef_t*)opj_malloc(sizeof(opj_jp2_cdef_t));
        if (!jp2->color.jp2_cdef) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Not enough memory to setup the JP2 encoder\n");
            return OPJ_FALSE;
        }
        /* no memset needed, all values will be overwritten except if jp2->color.jp2_cdef->info allocation fails, */
        /* in which case jp2->color.jp2_cdef->info will be NULL => valid for destruction */
        jp2->color.jp2_cdef->info = (opj_jp2_cdef_info_t*) opj_malloc(
                                        image->numcomps * sizeof(opj_jp2_cdef_info_t));
        if (!jp2->color.jp2_cdef->info) {
            /* memory will be freed by opj_jp2_destroy */
            opj_event_msg(p_manager, EVT_ERROR,
                          "Not enough memory to setup the JP2 encoder\n");
            return OPJ_FALSE;
        }
        jp2->color.jp2_cdef->n = (OPJ_UINT16)
                                 image->numcomps; /* cast is valid : image->numcomps [1,16384] */
        for (i = 0U; i < color_channels; i++) {
            jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                              i; /* cast is valid : image->numcomps [1,16384] */
            jp2->color.jp2_cdef->info[i].typ = 0U;
            jp2->color.jp2_cdef->info[i].asoc = (OPJ_UINT16)(i +
                                                1U); /* No overflow + cast is valid : image->numcomps [1,16384] */
        }
        for (; i < image->numcomps; i++) {
            if (image->comps[i].alpha != 0) { /* we'll be here exactly once */
                jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                                  i; /* cast is valid : image->numcomps [1,16384] */
                jp2->color.jp2_cdef->info[i].typ = 1U; /* Opacity channel */
                jp2->color.jp2_cdef->info[i].asoc =
                    0U; /* Apply alpha channel to the whole image */
            } else {
                /* Unknown channel */
                jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                                  i; /* cast is valid : image->numcomps [1,16384] */
                jp2->color.jp2_cdef->info[i].typ = 65535U;
                jp2->color.jp2_cdef->info[i].asoc = 65535U;
            }
        }
    }

    jp2->precedence = 0;    /* PRECEDENCE */
    jp2->approx = 0;        /* APPROX */

    jp2->jpip_on = parameters->jpip_on;

    return OPJ_TRUE;
}